

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay.cpp
# Opt level: O1

void __thiscall
ThreadedReplayer::resolve_pipeline_library_info
          (ThreadedReplayer *this,VkPipelineLibraryCreateInfoKHR *library,
          unordered_map<unsigned_long,_VkPipeline_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>_>
          *pipelines)

{
  uint uVar1;
  VkPipeline *ppVVar2;
  ulong uVar3;
  __node_base_ptr p_Var4;
  __node_base_ptr p_Var5;
  _Hash_node_base *p_Var6;
  VkPipeline pVVar7;
  ulong uVar8;
  ulong uVar9;
  __node_base_ptr p_Var10;
  
  uVar1 = library->libraryCount;
  if ((ulong)uVar1 != 0) {
    ppVVar2 = library->pLibraries;
    uVar3 = (pipelines->_M_h)._M_bucket_count;
    uVar9 = 0;
    do {
      pVVar7 = ppVVar2[uVar9];
      uVar8 = (ulong)pVVar7 % uVar3;
      p_Var4 = (pipelines->_M_h)._M_buckets[uVar8];
      p_Var5 = (__node_base_ptr)0x0;
      if ((p_Var4 != (__node_base_ptr)0x0) &&
         (p_Var5 = p_Var4, p_Var10 = p_Var4->_M_nxt, (VkPipeline)p_Var4->_M_nxt[1]._M_nxt != pVVar7)
         ) {
        while (p_Var6 = p_Var10->_M_nxt, p_Var6 != (_Hash_node_base *)0x0) {
          p_Var5 = (__node_base_ptr)0x0;
          if (((ulong)p_Var6[1]._M_nxt % uVar3 != uVar8) ||
             (p_Var5 = p_Var10, p_Var10 = p_Var6, (VkPipeline)p_Var6[1]._M_nxt == pVVar7))
          goto LAB_0014c4c2;
        }
        p_Var5 = (__node_base_ptr)0x0;
      }
LAB_0014c4c2:
      if (p_Var5 == (__node_base_ptr)0x0) {
        p_Var6 = (_Hash_node_base *)0x0;
      }
      else {
        p_Var6 = p_Var5->_M_nxt;
      }
      if (p_Var6 == (_Hash_node_base *)0x0) {
        pVVar7 = (VkPipeline)0x0;
      }
      else {
        pVVar7 = (VkPipeline)p_Var6[2]._M_nxt;
      }
      ppVVar2[uVar9] = pVVar7;
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar1);
  }
  return;
}

Assistant:

void resolve_pipeline_library_info(const VkPipelineLibraryCreateInfoKHR &library,
	                                   const unordered_map<Hash, VkPipeline> &pipelines) const
	{
		auto *libs = const_cast<VkPipeline *>(library.pLibraries);
		for (uint32_t i = 0; i < library.libraryCount; i++)
		{
			auto base_itr = pipelines.find((Hash) libs[i]);
			libs[i] = base_itr != end(pipelines) ? base_itr->second : VK_NULL_HANDLE;
		}
	}